

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnlabeledMultiArg.h
# Opt level: O3

bool __thiscall
TCLAP::
UnlabeledMultiArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::operator==(UnlabeledMultiArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this,Arg *a)

{
  size_t sVar1;
  int iVar2;
  bool bVar3;
  string local_38;
  
  sVar1 = (this->
          super_MultiArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ).super_Arg._name._M_string_length;
  if (sVar1 == (a->_name)._M_string_length) {
    if (sVar1 == 0) {
      return true;
    }
    iVar2 = bcmp((this->
                 super_MultiArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ).super_Arg._name._M_dataplus._M_p,(a->_name)._M_dataplus._M_p,sVar1);
    if (iVar2 == 0) {
      return true;
    }
  }
  Arg::getDescription_abi_cxx11_(&local_38,a);
  sVar1 = (this->
          super_MultiArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ).super_Arg._description._M_string_length;
  if (sVar1 == local_38._M_string_length) {
    if (sVar1 == 0) {
      bVar3 = true;
    }
    else {
      iVar2 = bcmp((this->
                   super_MultiArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ).super_Arg._description._M_dataplus._M_p,local_38._M_dataplus._M_p,sVar1);
      bVar3 = iVar2 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return bVar3;
}

Assistant:

bool UnlabeledMultiArg<T>::operator==(const Arg& a) const
{
	if ( _name == a.getName() || _description == a.getDescription() )
		return true;
	else
		return false;
}